

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> __thiscall
fmt::v8::detail::
write_int_noinline<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,
          write_int_arg<unsigned_long> arg,basic_format_specs<char8_t> *specs,locale_ref loc)

{
  ulong uVar1;
  presentation_type pVar2;
  long lVar3;
  uint uVar4;
  char *digits;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar5;
  byte *pbVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  basic_format_specs<char8_t> *specs_00;
  char *pcVar12;
  char *pcVar13;
  buffer<char8_t> *buf;
  int iVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  format_decimal_result<char8_t_*> fVar18;
  write_int_data<char8_t> data;
  char8_t buffer [20];
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_90;
  write_int_data<char8_t> local_88;
  anon_class_40_3_03e05ccd_conflict local_78;
  
  specs_00 = arg._8_8_;
  pVar2 = specs_00->type;
  uVar11 = (uint)arg.abs_value;
  local_90.container = (buffer<char8_t> *)this;
  local_78.write_digits.abs_value = (unsigned_long)out.container;
  switch(pVar2) {
  case none:
  case dec:
    if (((specs_00->field_0xa & 1) != 0) &&
       (bVar17 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,char8_t>
                           (&local_90,(unsigned_long)out.container,uVar11,specs_00,(locale_ref)specs
                           ), bVar17)) {
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)local_90.container;
    }
    bVar5.container = local_90.container;
    lVar15 = 0x3f;
    if (((ulong)out.container | 1) != 0) {
      for (; ((ulong)out.container | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    iVar14 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15] -
             (uint)(out.container <
                   *(buffer<char8_t> **)
                    (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                    (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15] * 8));
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_88,iVar14,uVar11,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar11;
      local_78.write_digits.num_digits = iVar14;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (bVar5,specs_00,local_88.size,local_88.size,
                         (anon_class_40_3_03e05ccd *)&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    if (-1 < iVar14) {
      if ((uVar11 != 0) &&
         (((undefined1  [16])arg & (undefined1  [16])0xffffff) != (undefined1  [16])0x0)) {
        uVar8 = (local_90.container)->size_;
        uVar11 = uVar11 & 0xffffff;
        do {
          uVar1 = uVar8 + 1;
          uVar9 = uVar8;
          uVar8 = uVar1;
          if ((bVar5.container)->capacity_ < uVar1) {
            (**(bVar5.container)->_vptr_buffer)(bVar5.container);
            uVar9 = (bVar5.container)->size_;
            uVar8 = uVar9 + 1;
          }
          (bVar5.container)->size_ = uVar8;
          (bVar5.container)->ptr_[uVar9] = (char8_t)uVar11;
          bVar17 = 0xff < uVar11;
          uVar11 = uVar11 >> 8;
        } while (bVar17);
      }
      fVar18 = format_decimal<char8_t,unsigned_long>
                         ((char8_t *)&local_78,(unsigned_long)out.container,iVar14);
      bVar5 = copy_str_noinline<char8_t,char8_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                        ((char8_t *)&local_78,fVar18.end,bVar5);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  case oct:
    bVar5.container = out.container;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = (buffer<char8_t> *)0x7 < bVar5.container;
      bVar5.container = bVar5.container >> 3;
    } while (bVar17);
    iVar14 = (int)lVar15;
    if (((specs_00->field_0x9 & 0x80) != 0) &&
       (out.container != (buffer<char8_t> *)0x0 && specs_00->precision <= iVar14)) {
      uVar10 = 0x3000;
      if (uVar11 == 0) {
        uVar10 = 0x30;
      }
      uVar11 = (uVar10 | uVar11) + 0x1000000;
    }
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_88,iVar14,uVar11,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar11;
      local_78.write_digits.num_digits = iVar14;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)this,specs_00,
                         local_88.size,local_88.size,(anon_class_40_3_03e05ccd *)&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    if ((uVar11 != 0) && ((uVar11 & 0xffffff) != 0)) {
      uVar8 = *(ulong *)(this + 0x10);
      uVar11 = uVar11 & 0xffffff;
      do {
        uVar1 = uVar8 + 1;
        uVar9 = uVar8;
        uVar8 = uVar1;
        if (*(ulong *)(this + 0x18) < uVar1) {
          (*(code *)**(undefined8 **)this)(this);
          uVar9 = *(ulong *)(this + 0x10);
          uVar8 = uVar9 + 1;
        }
        *(ulong *)(this + 0x10) = uVar8;
        *(char *)(*(long *)(this + 8) + uVar9) = (char)uVar11;
        bVar17 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar17);
    }
    lVar3 = *(long *)(this + 0x10);
    uVar8 = lVar3 + lVar15;
    if (uVar8 <= *(ulong *)(this + 0x18)) {
      *(ulong *)(this + 0x10) = uVar8;
      if (*(long *)(this + 8) != 0) {
        pbVar6 = (byte *)(lVar15 + *(long *)(this + 8) + lVar3);
        do {
          pbVar6 = pbVar6 + -1;
          *pbVar6 = (byte)out.container & 7 | 0x30;
          bVar17 = (buffer<char8_t> *)0x7 < out.container;
          out.container = out.container >> 3;
        } while (bVar17);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)(buffer<char8_t> *)this;
      }
    }
    pbVar6 = (byte *)((long)&local_78.prefix + lVar16);
    pcVar7 = (char *)((long)&local_78.prefix + lVar16 + 1);
    do {
      *pbVar6 = (byte)out.container & 7 | 0x30;
      pbVar6 = pbVar6 + -1;
      bVar17 = (buffer<char8_t> *)0x7 < out.container;
      out.container = out.container >> 3;
    } while (bVar17);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar2 != hex_upper) << 0xd | 0x5830;
      uVar10 = uVar4 << 8;
      if (uVar11 == 0) {
        uVar10 = uVar4;
      }
      uVar11 = (uVar10 | uVar11) + 0x2000000;
    }
    bVar5.container = out.container;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = (buffer<char8_t> *)0xf < bVar5.container;
      bVar5.container = bVar5.container >> 4;
    } while (bVar17);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      lVar16 = ((ulong)(pVar2 == hex_upper) << 0x20) + lVar15;
      write_int_data<char8_t>::write_int_data(&local_88,(int)lVar15,uVar11,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.write_digits.num_digits = (int)lVar16;
      local_78.write_digits.upper = SUB81((ulong)lVar16 >> 0x20,0);
      local_78.prefix = uVar11;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)this,specs_00,
                         local_88.size,local_88.size,&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    if ((uVar11 != 0) && ((uVar11 & 0xffffff) != 0)) {
      uVar8 = *(ulong *)(this + 0x10);
      uVar11 = uVar11 & 0xffffff;
      do {
        uVar1 = uVar8 + 1;
        uVar9 = uVar8;
        uVar8 = uVar1;
        if (*(ulong *)(this + 0x18) < uVar1) {
          (*(code *)**(undefined8 **)this)(this);
          uVar9 = *(ulong *)(this + 0x10);
          uVar8 = uVar9 + 1;
        }
        *(ulong *)(this + 0x10) = uVar8;
        *(char *)(*(long *)(this + 8) + uVar9) = (char)uVar11;
        bVar17 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar17);
    }
    lVar3 = *(long *)(this + 0x10);
    uVar8 = lVar3 + lVar15;
    if (uVar8 <= *(ulong *)(this + 0x18)) {
      *(ulong *)(this + 0x10) = uVar8;
      if (*(long *)(this + 8) != 0) {
        pcVar7 = "0123456789abcdef";
        if (pVar2 == hex_upper) {
          pcVar7 = "0123456789ABCDEF";
        }
        pcVar12 = (char *)(*(long *)(this + 8) + lVar3 + lVar15);
        do {
          pcVar12 = pcVar12 + -1;
          *pcVar12 = pcVar7[(uint)out.container & 0xf];
          bVar17 = (buffer<char8_t> *)0xf < out.container;
          out.container = out.container >> 4;
        } while (bVar17);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)(buffer<char8_t> *)this;
      }
    }
    pcVar12 = (char *)((long)&local_78.prefix + lVar16);
    pcVar7 = (char *)((long)&local_78.prefix + lVar16 + 1);
    pcVar13 = "0123456789abcdef";
    if (pVar2 == hex_upper) {
      pcVar13 = "0123456789ABCDEF";
    }
    do {
      *pcVar12 = pcVar13[(uint)out.container & 0xf];
      pcVar12 = pcVar12 + -1;
      bVar17 = (buffer<char8_t> *)0xf < out.container;
      out.container = out.container >> 4;
    } while (bVar17);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar2 != bin_upper) << 0xd | 0x4230;
      uVar10 = uVar4 << 8;
      if (uVar11 == 0) {
        uVar10 = uVar4;
      }
      uVar11 = (uVar10 | uVar11) + 0x2000000;
    }
    bVar5.container = out.container;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = (buffer<char8_t> *)0x1 < bVar5.container;
      bVar5.container = bVar5.container >> 1;
    } while (bVar17);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_88,(int)lVar15,uVar11,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar11;
      local_78.write_digits.num_digits = (int)lVar15;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned_long>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)this,specs_00,
                         local_88.size,local_88.size,(anon_class_40_3_03e05ccd *)&local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    if ((uVar11 != 0) && ((uVar11 & 0xffffff) != 0)) {
      uVar8 = *(ulong *)(this + 0x10);
      uVar11 = uVar11 & 0xffffff;
      do {
        uVar1 = uVar8 + 1;
        uVar9 = uVar8;
        uVar8 = uVar1;
        if (*(ulong *)(this + 0x18) < uVar1) {
          (*(code *)**(undefined8 **)this)(this);
          uVar9 = *(ulong *)(this + 0x10);
          uVar8 = uVar9 + 1;
        }
        *(ulong *)(this + 0x10) = uVar8;
        *(char *)(*(long *)(this + 8) + uVar9) = (char)uVar11;
        bVar17 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar17);
    }
    lVar3 = *(long *)(this + 0x10);
    uVar8 = lVar3 + lVar15;
    if (uVar8 <= *(ulong *)(this + 0x18)) {
      *(ulong *)(this + 0x10) = uVar8;
      if (*(long *)(this + 8) != 0) {
        pbVar6 = (byte *)(lVar15 + *(long *)(this + 8) + lVar3);
        do {
          pbVar6 = pbVar6 + -1;
          *pbVar6 = (byte)out.container & 1 | 0x30;
          bVar17 = (buffer<char8_t> *)0x1 < out.container;
          out.container = out.container >> 1;
        } while (bVar17);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)(buffer<char8_t> *)this;
      }
    }
    pbVar6 = (byte *)((long)&local_78.prefix + lVar16);
    pcVar7 = (char *)((long)&local_78.prefix + lVar16 + 1);
    do {
      *pbVar6 = (byte)out.container & 1 | 0x30;
      pbVar6 = pbVar6 + -1;
      bVar17 = (buffer<char8_t> *)0x1 < out.container;
      out.container = out.container >> 1;
    } while (bVar17);
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
  case chr:
    local_78.prefix = CONCAT31(local_78.prefix._1_3_,(char)out.container);
    bVar5 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_char<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::basic_format_specs<char8_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                      ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)this,specs_00,1,1,
                       (anon_class_1_1_a8c68091 *)&local_78);
    return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
  }
  bVar5 = copy_str_noinline<char8_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                    ((char *)&local_78,pcVar7,
                     (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)this);
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}